

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_traits.h
# Opt level: O1

void google::protobuf::json_internal::ParseProto2Descriptor::SetFloat(Field f,Msg *msg,float x)

{
  byte bVar1;
  string *psVar2;
  bool bVar3;
  ulong *puVar4;
  Metadata MVar5;
  ulong local_28 [2];
  
  RecordAsSeen(f,msg);
  bVar1 = f->field_0x1;
  bVar3 = (bool)((bVar1 & 0x20) >> 5);
  if (0xbf < bVar1 == bVar3) {
    psVar2 = (string *)0x0;
  }
  else {
    psVar2 = absl::lts_20240722::log_internal::MakeCheckOpString<bool,bool>
                       (bVar3,0xbf < bVar1,"is_repeated_ == label() == LABEL_REPEATED");
  }
  if (psVar2 == (string *)0x0) {
    bVar1 = f->field_0x1;
    MVar5 = Message::GetMetadata(msg->msg_);
    if ((bVar1 & 0x20) == 0) {
      Reflection::SetFloat(MVar5.reflection,msg->msg_,f,x);
      return;
    }
    Reflection::AddFloat(MVar5.reflection,msg->msg_,f,x);
    return;
  }
  puVar4 = local_28;
  SetFloat();
  if ((*puVar4 & 1) == 0) {
    absl::lts_20240722::status_internal::StatusRep::Unref();
  }
  return;
}

Assistant:

static void SetFloat(Field f, Msg& msg, float x) {
    RecordAsSeen(f, msg);
    if (f->is_repeated()) {
      msg.msg_->GetReflection()->AddFloat(msg.msg_, f, x);
    } else {
      msg.msg_->GetReflection()->SetFloat(msg.msg_, f, x);
    }
  }